

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall fmt::v9::detail::bigint::remove_leading_zeros(bigint *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)(uint)(this->bigits_).super_buffer<unsigned_int>.size_;
  do {
    uVar2 = uVar1;
    if ((int)uVar2 < 2) {
      if ((int)uVar2 < 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/fmt-src/include/fmt/core.h"
                    ,0x199,"negative value");
      }
      break;
    }
    uVar1 = uVar2 - 1;
  } while ((this->bigits_).super_buffer<unsigned_int>.ptr_[uVar2 - 1] == 0);
  uVar1 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar1 < uVar2) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar2);
    uVar1 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  }
  if (uVar1 < uVar2) {
    uVar2 = uVar1;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar2;
  return;
}

Assistant:

FMT_CONSTEXPR20 void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && (*this)[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }